

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  ON_Interval proxy_curve_subdomain;
  ON_Interval real_curve_subdomain;
  bool bVar1;
  ON_Brep *this_00;
  ON_Curve *pOVar2;
  ON_NurbsSurface *pOVar3;
  ON_BrepVertex *pOVar4;
  ON_BrepEdge *this_01;
  ON_BrepTrim *this_02;
  ON_BrepLoop *pOVar5;
  ON_BrepFace *pOVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int sz;
  int j;
  bool bHaveMat;
  ON_3dmObjectAttributes *local_c0;
  ON__UINT32 tcode;
  int version;
  ON__INT64 big_value;
  ON_Curve *curve;
  double local_a0;
  ON_3dPoint local_90;
  double tol3d;
  double tol2d;
  ON_3dPoint m_oldTrim_mP [2];
  
  bHaveMat = false;
  tcode = 0;
  big_value = 0;
  bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
  if (!bVar1) {
    return false;
  }
  if (tcode == 0x2fffe) {
    version = -1;
    bVar1 = ReadInt(this,&version);
    if (!bVar1) goto LAB_003d7649;
    if (version - 0x66U < 0xfffffffe) {
      return false;
    }
    this_00 = (ON_Brep *)operator_new(0x138);
    ON_Brep::ON_Brep(this_00);
    bVar1 = ReadInt(this,&sz);
    if (bVar1) {
      iVar7 = 0;
      if ((long)sz < 1) goto LAB_003d764e;
      local_c0 = pAttributes;
      ON_SimpleArray<ON_Curve_*>::Reserve
                (&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)sz);
      for (; iVar7 < sz; iVar7 = iVar7 + 1) {
        pOVar2 = ReadV1_RHINOIO_BREP_CURVE(this);
        curve._0_4_ = (uint)pOVar2;
        curve._4_4_ = (undefined4)((ulong)pOVar2 >> 0x20);
        if (pOVar2 == (ON_Curve *)0x0) break;
        ON_SimpleArray<ON_Curve_*>::Append(&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,&curve)
        ;
      }
      if (sz <= iVar7) {
        bVar1 = ReadInt(this,&sz);
        pAttributes = local_c0;
        if (!bVar1) goto LAB_003d764c;
        iVar7 = 0;
        if ((long)sz < 1) goto LAB_003d764e;
        ON_SimpleArray<ON_Curve_*>::Reserve
                  (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)sz);
        for (; iVar7 < sz; iVar7 = iVar7 + 1) {
          pOVar2 = ReadV1_RHINOIO_BREP_CURVE(this);
          curve._0_4_ = (uint)pOVar2;
          curve._4_4_ = (undefined4)((ulong)pOVar2 >> 0x20);
          if (pOVar2 == (ON_Curve *)0x0) break;
          ON_SimpleArray<ON_Curve_*>::Append
                    (&(this_00->m_C3).super_ON_SimpleArray<ON_Curve_*>,&curve);
        }
        if ((sz <= iVar7) && (bVar1 = ReadInt(this,&sz), bVar1)) {
          iVar9 = 0;
          if (0 < (long)sz) {
            ON_SimpleArray<ON_Surface_*>::Reserve
                      (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,(long)sz);
            for (; iVar9 < sz; iVar9 = iVar9 + 1) {
              tcode = 0;
              big_value = 0;
              bVar1 = BeginRead3dmBigChunk(this,&tcode,&big_value);
              if (!bVar1) break;
              if (tcode == 0x20009) {
                pOVar3 = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA(this);
              }
              else {
                pOVar3 = (ON_NurbsSurface *)0x0;
              }
              bVar1 = EndRead3dmChunk(this);
              if ((pOVar3 == (ON_NurbsSurface *)0x0) || (!bVar1)) break;
              curve._0_4_ = (uint)pOVar3;
              curve._4_4_ = (undefined4)((ulong)pOVar3 >> 0x20);
              ON_SimpleArray<ON_Surface_*>::Append
                        (&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,(ON_Surface **)&curve);
            }
            iVar7 = 0;
            pAttributes = local_c0;
            if (iVar9 < sz) goto LAB_003d764e;
            ReadInt(this,&sz);
            ON_ClassArray<ON_BrepVertex>::Reserve
                      ((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,(long)sz);
            for (; iVar7 < sz; iVar7 = iVar7 + 1) {
              pOVar4 = ON_Brep::NewVertex(this_00);
              bVar1 = ReadInt(this,&pOVar4->m_vertex_index);
              if ((((!bVar1) || (bVar1 = ReadPoint(this,&(pOVar4->super_ON_Point).point), !bVar1))
                  || (bVar1 = ReadArray(this,&pOVar4->m_ei), !bVar1)) ||
                 (bVar1 = ReadDouble(this,&pOVar4->m_tolerance), !bVar1)) break;
            }
            iVar9 = 0;
            if (sz <= iVar7) {
              ReadInt(this,&sz);
              ON_ClassArray<ON_BrepEdge>::Reserve
                        ((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,(long)sz);
              for (; iVar9 < sz; iVar9 = iVar9 + 1) {
                ON_Interval::ON_Interval((ON_Interval *)&curve);
                this_01 = ON_Brep::NewEdge(this_00,-1);
                bVar1 = ReadInt(this,&this_01->m_edge_index);
                if (((!bVar1) || (bVar1 = ReadInt(this,&this_01->m_c3i), !bVar1)) ||
                   (bVar1 = ReadInterval(this,(ON_Interval *)&curve), !bVar1)) break;
                proxy_curve_subdomain.m_t[0]._4_4_ = curve._4_4_;
                proxy_curve_subdomain.m_t[0]._0_4_ = (uint)curve;
                proxy_curve_subdomain.m_t[1] = local_a0;
                ON_CurveProxy::SetProxyCurveDomain
                          (&this_01->super_ON_CurveProxy,proxy_curve_subdomain);
                bVar1 = ReadInt32(this,2,this_01->m_vi);
                if (((!bVar1) || (bVar1 = ReadArray(this,&this_01->m_ti), !bVar1)) ||
                   (bVar1 = ReadDouble(this,&this_01->m_tolerance), !bVar1)) break;
              }
              iVar8 = 0;
              iVar7 = 0;
              pAttributes = local_c0;
              if (iVar9 < sz) goto LAB_003d764e;
              ReadInt(this,&sz);
              ON_ClassArray<ON_BrepTrim>::Reserve
                        ((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,(long)sz);
              for (; iVar8 < sz; iVar8 = iVar8 + 1) {
                this_02 = ON_Brep::NewTrim(this_00,-1);
                bVar1 = ReadInt(this,&this_02->m_trim_index);
                if ((!bVar1) || (bVar1 = ReadInt(this,&this_02->m_c2i), !bVar1)) break;
                ON_Interval::ON_Interval((ON_Interval *)&curve);
                bVar1 = ReadInterval(this,(ON_Interval *)&curve);
                if (!bVar1) break;
                real_curve_subdomain.m_t[0]._4_4_ = curve._4_4_;
                real_curve_subdomain.m_t[0]._0_4_ = (uint)curve;
                real_curve_subdomain.m_t[1] = local_a0;
                ON_CurveProxy::SetProxyCurve
                          (&this_02->super_ON_CurveProxy,(ON_Curve *)0x0,real_curve_subdomain);
                bVar1 = ReadInt(this,&this_02->m_ei);
                if ((!bVar1) || (bVar1 = ReadInt32(this,2,this_02->m_vi), !bVar1)) break;
                j = (int)this_02->m_bRev3d;
                bVar1 = ReadInt(this,&j);
                if (!bVar1) break;
                this_02->m_bRev3d = j != 0;
                bVar1 = ReadInt(this,&j);
                if (!bVar1) break;
                if (j - 1U < 4) {
                  this_02->m_type = j;
                }
                bVar1 = ReadInt(this,&j);
                if (((((!bVar1) || (bVar1 = ReadInt(this,&this_02->m_li), !bVar1)) ||
                     (bVar1 = ReadDouble(this,2,this_02->m_tolerance), !bVar1)) ||
                    ((bVar1 = ReadPoint(this,m_oldTrim_mP), !bVar1 ||
                     (bVar1 = ReadPoint(this,m_oldTrim_mP + 1), !bVar1)))) ||
                   ((bVar1 = ReadDouble(this,&tol2d), !bVar1 ||
                    (bVar1 = ReadDouble(this,&tol3d), !bVar1)))) break;
              }
              iVar9 = 0;
              if (sz <= iVar8) {
                ReadInt(this,&sz);
                ON_ClassArray<ON_BrepLoop>::Reserve
                          ((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,(long)sz);
                for (; iVar9 < sz; iVar9 = iVar9 + 1) {
                  pOVar5 = ON_Brep::NewLoop(this_00,unknown);
                  bVar1 = ReadInt(this,&pOVar5->m_loop_index);
                  if (((!bVar1) || (bVar1 = ReadArray(this,&pOVar5->m_ti), !bVar1)) ||
                     (bVar1 = ReadInt(this,&j), !bVar1)) break;
                  if (j - 1U < 3) {
                    pOVar5->m_type = j;
                  }
                  bVar1 = ReadInt(this,&pOVar5->m_fi);
                  if (!bVar1) break;
                }
                iVar8 = 0;
                iVar7 = 0;
                pAttributes = local_c0;
                if (iVar9 < sz) goto LAB_003d764e;
                ReadInt(this,&sz);
                ON_ClassArray<ON_BrepFace>::Reserve
                          ((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,(long)sz);
                for (; iVar8 < sz; iVar8 = iVar8 + 1) {
                  pOVar6 = ON_Brep::NewFace(this_00,-1);
                  bVar1 = ReadInt(this,&pOVar6->m_face_index);
                  if (((!bVar1) || (bVar1 = ReadArray(this,&pOVar6->m_li), !bVar1)) ||
                     (bVar1 = ReadInt(this,&pOVar6->m_si), !bVar1)) break;
                  curve._0_4_ = (uint)pOVar6->m_bRev;
                  bVar1 = ReadInt(this,(ON__INT32 *)&curve);
                  if (!bVar1) break;
                  pOVar6->m_bRev = (uint)curve != 0;
                }
                if (sz <= iVar8) {
                  ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&curve);
                  bVar1 = ReadPoint(this,(ON_3dPoint *)&curve);
                  if (bVar1) {
                    bVar1 = ReadPoint(this,&local_90);
                    iVar7 = 1;
                    pAttributes = local_c0;
                    if (bVar1) goto LAB_003d764e;
                  }
                }
              }
            }
          }
        }
      }
      iVar7 = 0;
      pAttributes = local_c0;
      goto LAB_003d764e;
    }
  }
  else {
LAB_003d7649:
    this_00 = (ON_Brep *)0x0;
  }
LAB_003d764c:
  iVar7 = 0;
LAB_003d764e:
  bVar1 = EndRead3dmChunk(this);
  if (((this_00 != (ON_Brep *)0x0) && ((char)iVar7 != '\0')) && (bVar1)) {
    ON_Brep::SetTrimIsoFlags(this_00);
    *ppObject = (ON_Object *)this_00;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,&bHaveMat,0x2ffff,(ON__3dmV1_XDATA *)0x0);
    return true;
  }
  if (this_00 != (ON_Brep *)0x0) {
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_RHINOIO_OBJECT_BREP(
  ON_Object** ppObject,
  ON_3dmObjectAttributes* pAttributes
  )
{
  ON_3dPoint m_oldTrim_mP[2];
  bool bHaveMat = false;
  bool rc = false;
  ON_Brep* brep = 0;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  if ( !BeginRead3dmBigChunk( &tcode, &big_value ) )
    return false;
  if ( tcode == TCODE_RHINOIO_OBJECT_DATA ) for (;;) {
    int version = -1;
    int sz, i, j;
    double tol2d, tol3d;
    if ( !ReadInt( &version ) ) 
      break; // serialization version
    // version = 100 means the b-rep was written by the RhinoIO toolkit
    // version = 101 means the b-rep was written by Rhino 1.0
    if ( version != 100 && version != 101 ) {
      return false;
    }

    brep = new ON_Brep();

    // 2d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C2.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C2.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d trimming curves
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_C3.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_Curve* curve = ReadV1_RHINOIO_BREP_CURVE( *this );
      if ( !curve )
        break;
      brep->m_C3.Append(curve);
    }
    if ( i < sz )
      break;

    // 3d untrimmed surfaces
    if ( !ReadInt( &sz ) )
      break;
    if ( sz < 1 ) {
      break;
    }
    brep->m_S.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_NurbsSurface* surface = 0;
      tcode = 0;
      big_value = 0;
      if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
        break;
      if ( tcode == TCODE_RHINOIO_OBJECT_NURBS_SURFACE ) {
        surface = ReadV1_RHINOIO_NURBS_SURFACE_OBJECT_DATA( *this );
      }
      if ( !EndRead3dmChunk() )
        break;
      if ( !surface )
        break;
      brep->m_S.Append(surface);
    }
    if ( i < sz )
      break;

    // vertices
    ReadInt( &sz );
    brep->m_V.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepVertex& vertex = brep->NewVertex();
      if ( !ReadInt( &vertex.m_vertex_index ) ) break;
      if ( !ReadPoint( vertex.point ) ) break;
      if ( !ReadArray( vertex.m_ei ) ) break;
      if ( !ReadDouble( &vertex.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // edges
    ReadInt( &sz );
    brep->m_E.Reserve(sz);
    for ( i = 0; i < sz; i++ ) 
    {
      ON_Interval proxy_domain;
      ON_BrepEdge& edge = brep->NewEdge();
      if ( !ReadInt( &edge.m_edge_index ) ) break;
      if ( !ReadInt( &edge.m_c3i ) ) break;
      if ( !ReadInterval( proxy_domain ) ) break;
      edge.SetProxyCurveDomain(proxy_domain);
      if ( !ReadInt( 2, edge.m_vi ) ) break;
      if ( !ReadArray( edge.m_ti ) ) break;
      if ( !ReadDouble( &edge.m_tolerance ) ) break;
    }
    if ( i < sz )
      break;

    // trims
    ReadInt( &sz );
    brep->m_T.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepTrim& trim = brep->NewTrim();
      if ( !ReadInt( &trim.m_trim_index ) ) break;
      if ( !ReadInt( &trim.m_c2i ) ) break;
      ON_Interval d;
      if ( !ReadInterval( d ) ) 
        break;
      trim.SetProxyCurve(nullptr,d);
      if ( !ReadInt( &trim.m_ei ) ) break;
      if ( !ReadInt( 2, trim.m_vi ) ) break;
      j = trim.m_bRev3d;
      if ( !ReadInt( &j ) ) break;
      trim.m_bRev3d = (j!=0);
      if ( !ReadInt( &j ) ) break;
      switch(j) {
      case 1: trim.m_type = ON_BrepTrim::boundary; break;
      case 2: trim.m_type = ON_BrepTrim::mated; break;
      case 3: trim.m_type = ON_BrepTrim::seam; break;
      case 4: trim.m_type = ON_BrepTrim::singular; break;
      }
      if ( !ReadInt( &j ) ) break; // legacy iso flag - ignore and recaluate
      if ( !ReadInt( &trim.m_li ) ) break;
      if ( !ReadDouble( 2, trim.m_tolerance ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[0] ) ) break;
      if ( !ReadPoint( m_oldTrim_mP[1] ) ) break;
      if ( !ReadDouble( &tol2d ) ) break;
      if ( !ReadDouble( &tol3d ) ) break;
    }
    if ( i < sz )
      break;

    // loops
    ReadInt( &sz );
    brep->m_L.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepLoop& loop = brep->NewLoop(ON_BrepLoop::unknown);
      if ( !ReadInt( &loop.m_loop_index ) ) break;
      if ( !ReadArray( loop.m_ti ) ) break;
      if ( !ReadInt( &j ) ) break;
      switch (j) {
      case 1: loop.m_type = ON_BrepLoop::outer; break;
      case 2: loop.m_type = ON_BrepLoop::inner; break;
      case 3: loop.m_type = ON_BrepLoop::slit; break;
      }
      if ( !ReadInt( &loop.m_fi ) ) break;
    }
    if ( i < sz )
      break;

    // faces
    ReadInt( &sz );
    brep->m_F.Reserve(sz);
    for ( i = 0; i < sz; i++ ) {
      ON_BrepFace& face = brep->NewFace();
      if ( !ReadInt( &face.m_face_index ) ) break;
      if ( !ReadArray( face.m_li ) ) break;
      if ( !ReadInt( &face.m_si ) ) break;
      int k = face.m_bRev;
      if ( !ReadInt( &k ) ) break;
      face.m_bRev = (k!=0);
    }
    if ( i < sz )
      break;

    // bounding box
    {
      ON_BoundingBox bbox;
      if ( !ReadPoint( bbox.m_min ) ) break;
      if ( !ReadPoint( bbox.m_max ) ) break;
    }

    rc = true;
    break;
  }
  if ( !EndRead3dmChunk() )
    rc = false;
  if ( rc && brep ) {
    brep->SetTrimIsoFlags();
    *ppObject = brep;
  }
  else {
    if ( brep )
      delete brep;
    rc = false;
  }

  if ( rc && brep ) {
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_RHINOIO_OBJECT_END);
  }

  return rc;
}